

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClass
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  bool bVar1;
  int i;
  long lVar2;
  Printer *this_00;
  Generator *this_01;
  int i_2;
  long lVar3;
  
  if (*(char *)(*(long *)(desc + 0x20) + 0x6b) == '\0') {
    this_00 = printer;
    io::Printer::Print(printer,"\n");
    GenerateClassConstructor((Generator *)this_00,options,printer,desc);
    GenerateClassFieldInfo(this,options,printer,desc);
    GenerateClassToObject(this,options,printer,desc);
    GenerateClassDeserializeBinary(this,options,printer,desc);
    this_01 = this;
    GenerateClassSerializeBinary(this,options,printer,desc);
    lVar3 = 0;
    for (lVar2 = 0; lVar2 < *(int *)(desc + 0x58); lVar2 = lVar2 + 1) {
      GenerateEnum(this_01,options,printer,(EnumDescriptor *)(*(long *)(desc + 0x60) + lVar3));
      lVar3 = lVar3 + 0x38;
    }
    lVar3 = 0;
    for (lVar2 = 0; lVar2 < *(int *)(desc + 0x48); lVar2 = lVar2 + 1) {
      GenerateClass(this,options,printer,(Descriptor *)(*(long *)(desc + 0x50) + lVar3));
      lVar3 = lVar3 + 0xa8;
    }
    GenerateClassRegistration(this,options,printer,desc);
    GenerateClassFields(this,options,printer,desc);
    if (0 < *(int *)(desc + 0x68)) {
      this = *(Generator **)(desc + 8);
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              this,"google.protobuf.bridge.MessageSet");
      if (bVar1) {
        GenerateClassExtensionFieldInfo(this,options,printer,desc);
      }
    }
    if (options->import_style != kImportClosure) {
      lVar2 = 0;
      for (lVar3 = 0; lVar3 < *(int *)(desc + 0x78); lVar3 = lVar3 + 1) {
        GenerateExtension(this,options,printer,(FieldDescriptor *)(*(long *)(desc + 0x80) + lVar2));
        lVar2 = lVar2 + 0xa8;
      }
    }
  }
  return;
}

Assistant:

void Generator::GenerateTestOnly(const GeneratorOptions& options,
                                 io::Printer* printer) const {
  if (options.testonly) {
    printer->Print("goog.setTestOnly();\n\n");
  }
  printer->Print("\n");
}